

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

AActor * __thiscall FBlockThingsIterator::Next(FBlockThingsIterator *this,bool centeronly)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  AActor *pAVar4;
  FBlockNode *pFVar5;
  bool bVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  FBlockNode **ppFVar10;
  int iVar11;
  long lVar12;
  HashEntry *pHVar13;
  FBlockNode *pFVar14;
  HashEntry *pHVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  double blockleft;
  double dVar19;
  double dVar20;
  
  ppFVar10 = blocklinks;
  dVar9 = bmaporgy;
  dVar8 = bmaporgx;
  iVar7 = bmapheight;
  iVar11 = bmapwidth;
  pFVar14 = this->block;
  uVar17 = this->curx;
  uVar16 = this->cury;
  pHVar13 = (this->DynHash).Array;
  do {
    if (pFVar14 != (FBlockNode *)0x0) {
      dVar19 = (double)(int)(uVar17 << 7) + dVar8;
      dVar20 = (double)(int)(uVar16 << 7) + dVar9;
      do {
        pAVar4 = pFVar14->Me;
        pFVar5 = pFVar14->NextActor;
        if ((pFVar14->NextBlock == (FBlockNode *)0x0) && (pFVar14->PrevBlock == &pAVar4->BlockNode))
        {
LAB_0041b26c:
          this->block = pFVar5;
          return pAVar4;
        }
        if (centeronly) {
          dVar1 = (pAVar4->__Pos).X;
          if ((((dVar19 <= dVar1) && (dVar1 < dVar19 + 128.0)) &&
              (dVar1 = (pAVar4->__Pos).Y, dVar20 <= dVar1)) && (dVar1 < dVar20 + 128.0))
          goto LAB_0041b26c;
        }
        else {
          uVar18 = (uint)((ulong)pAVar4 >> 3) & 0x1f;
          uVar2 = this->Buckets[uVar18];
          uVar3 = uVar2;
          while( true ) {
            if ((int)uVar3 < 0) {
              this->block = pFVar5;
              iVar11 = this->NumFixedHash;
              lVar12 = (long)iVar11;
              if (lVar12 < 10) {
                pHVar13 = this->FixedHash + lVar12;
                this->FixedHash[lVar12].Next = uVar2;
                this->NumFixedHash = iVar11 + 1;
              }
              else {
                if ((this->DynHash).Count == 0) {
                  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::Grow
                            (&this->DynHash,0x32);
                }
                TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::Grow
                          (&this->DynHash,1);
                uVar17 = (this->DynHash).Count;
                (this->DynHash).Count = uVar17 + 1;
                pHVar15 = (this->DynHash).Array;
                iVar11 = uVar17 + 10;
                pHVar13 = pHVar15 + (int)uVar17;
                pHVar15[(int)uVar17].Next = this->Buckets[uVar18];
              }
              this->Buckets[uVar18] = iVar11;
              pHVar13->Actor = pAVar4;
              return pAVar4;
            }
            pHVar15 = pHVar13 + -10;
            if (uVar3 < 10) {
              pHVar15 = this->FixedHash;
            }
            if (pHVar15[uVar3].Actor == pAVar4) break;
            uVar3 = pHVar15[uVar3].Next;
          }
        }
        pFVar14 = pFVar5;
      } while (pFVar5 != (FBlockNode *)0x0);
      this->block = (FBlockNode *)0x0;
    }
    this->curx = uVar17 + 1;
    bVar6 = this->maxx <= (int)uVar17;
    uVar17 = uVar17 + 1;
    if (bVar6) {
      this->curx = this->minx;
      this->cury = uVar16 + 1;
      bVar6 = this->maxy <= (int)uVar16;
      uVar17 = this->minx;
      uVar16 = uVar16 + 1;
      if (bVar6) {
        return (AActor *)0x0;
      }
    }
    if (((int)(uVar16 | uVar17) < 0) || (iVar11 <= (int)uVar17)) {
      pFVar14 = (FBlockNode *)0x0;
    }
    else {
      pFVar14 = (FBlockNode *)0x0;
      if ((int)uVar16 < iVar7) {
        pFVar14 = ppFVar10[iVar11 * uVar16 + uVar17];
      }
    }
    this->block = pFVar14;
  } while( true );
}

Assistant:

AActor *FBlockThingsIterator::Next(bool centeronly)
{
	for (;;)
	{
		while (block != NULL)
		{
			AActor *me = block->Me;
			FBlockNode *mynode = block;
			HashEntry *entry;
			int i;

			block = block->NextActor;
			// Don't recheck things that were already checked
			if (mynode->NextBlock == NULL && mynode->PrevBlock == &me->BlockNode)
			{ // This actor doesn't span blocks, so we know it can only ever be checked once.
				return me;
			}
			if (centeronly)
			{
				// Block boundaries for compatibility mode
				double blockleft = (curx * MAPBLOCKUNITS) + bmaporgx;
				double blockright = blockleft + MAPBLOCKUNITS;
				double blockbottom = (cury * MAPBLOCKUNITS) + bmaporgy;
				double blocktop = blockbottom + MAPBLOCKUNITS;

				// only return actors with the center in this block
				if (me->X() >= blockleft && me->X() < blockright &&
					me->Y() >= blockbottom && me->Y() < blocktop)
				{
					return me;
				}
			}
			else
			{
				size_t hash = ((size_t)me >> 3) % countof(Buckets);
				for (i = Buckets[hash]; i >= 0; )
				{
					entry = GetHashEntry(i);
					if (entry->Actor == me)
					{ // I've already been checked. Skip to the next actor.
						break;
					}
					i = entry->Next;
				}
				if (i < 0)
				{ // Add me to the hash table and return me.
					if (NumFixedHash < (int)countof(FixedHash))
					{
						entry = &FixedHash[NumFixedHash];
						entry->Next = Buckets[hash];
						Buckets[hash] = NumFixedHash++;
					}
					else
					{
						if (DynHash.Size() == 0)
						{
							DynHash.Grow(50);
						}
						i = DynHash.Reserve(1);
						entry = &DynHash[i];
						entry->Next = Buckets[hash];
						Buckets[hash] = i + countof(FixedHash);
					}
					entry->Actor = me;
					return me;
				}
			}
		}

		if (++curx > maxx)
		{
			curx = minx;
			if (++cury > maxy) return NULL;
		}
		StartBlock(curx, cury);
	}
}